

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprIsConstant(Expr *p)

{
  int iVar1;
  
  iVar1 = exprIsConst(p,1,0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsConstant(Expr *p){
  return exprIsConst(p, 1, 0);
}